

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O0

optional<SignetTxs> * SignetTxs::Create(CBlock *block,CScript *challenge)

{
  Span<const_unsigned_char> data;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  reference pvVar5;
  optional<SignetTxs> *in_RDI;
  long in_FS_OFFSET;
  exception *anon_var_0;
  CScript *witness_commitment;
  int cidx;
  VectorWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_data;
  SpanReader v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signet_solution;
  CMutableTransaction modified_cb;
  CMutableTransaction tx_spending;
  CMutableTransaction tx_to_spend;
  uint256 signet_merkle;
  undefined4 in_stack_fffffffffffffbc8;
  uint32_t in_stack_fffffffffffffbcc;
  SignetTxs *in_stack_fffffffffffffbd0;
  COutPoint *in_stack_fffffffffffffbd8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbe0;
  CBlock *in_stack_fffffffffffffbe8;
  CMutableTransaction *pCVar6;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  CMutableTransaction *in_stack_fffffffffffffbf8;
  SignetTxs *this;
  undefined7 in_stack_fffffffffffffc00;
  CBlock *block_00;
  CScript *result;
  CScript *in_stack_fffffffffffffc70;
  CMutableTransaction local_338;
  Span<const_unsigned_char> in_stack_fffffffffffffd10;
  undefined1 local_298 [48];
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  uchar local_228 [300];
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  undefined8 uStack_e4;
  uint32_t local_dc;
  CMutableTransaction local_98 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_228[0] = '\0';
  local_228[1] = '\0';
  local_228[2] = '\0';
  local_228[3] = '\0';
  local_228[4] = '\0';
  local_228[5] = '\0';
  local_228[6] = '\0';
  local_228[7] = '\0';
  COutPoint::COutPoint((COutPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CScript::CScript((CScript *)in_stack_fffffffffffffbe8,
                   (opcodetype)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
  local_25c = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            (&in_stack_fffffffffffffbf8->vin,
             (COutPoint *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (CScript *)in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_260 = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript_const&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffbe8,
             (int *)in_stack_fffffffffffffbe0,(CScript *)in_stack_fffffffffffffbd8);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_268 = 0;
  local_264 = 0;
  COutPoint::COutPoint((COutPoint *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_98[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98[0].vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98[0].vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pCVar6 = local_98;
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript,int>
            (&in_stack_fffffffffffffbf8->vin,
             (COutPoint *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (CScript *)in_stack_fffffffffffffbe8,(int *)in_stack_fffffffffffffbe0);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  block_00 = (CBlock *)(local_298 + 0x18);
  CScript::CScript((CScript *)in_stack_fffffffffffffbe8,
                   (opcodetype)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffbe8,
             (int *)in_stack_fffffffffffffbe0,(CScript *)in_stack_fffffffffffffbd8);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  bVar1 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)in_stack_fffffffffffffbd8);
  if (bVar1) {
    std::optional<SignetTxs>::optional(in_RDI);
    goto LAB_01407dc8;
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        *)in_stack_fffffffffffffbd8,(size_type)in_stack_fffffffffffffbd0);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffbd8);
  CMutableTransaction::CMutableTransaction
            (in_stack_fffffffffffffbf8,
             (CTransaction *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  iVar3 = GetWitnessCommitmentIndex(in_stack_fffffffffffffbe8);
  if (iVar3 == -1) {
    std::optional<SignetTxs>::optional(in_RDI);
  }
  else {
    _Var4._M_extent_value =
         (size_t)std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                           ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffbd8,
                            (size_type)in_stack_fffffffffffffbd0);
    result = &((reference)_Var4._M_extent_value)->scriptPubKey;
    this = (SignetTxs *)&stack0xfffffffffffffd10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    Span<const_unsigned_char>::Span<4>
              ((Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (uchar (*) [4])0x1407a0f);
    uVar2 = FetchAndClearCommitmentSection
                      (in_stack_fffffffffffffd10,in_stack_fffffffffffffc70,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)result);
    if ((bool)uVar2) {
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffbd8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0,
                 (type)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      data.m_size = (size_t)in_stack_fffffffffffffbd8;
      data.m_data = (uchar *)in_stack_fffffffffffffbd0;
      SpanReader::SpanReader
                ((SpanReader *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),data);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbd8,
                 (size_type)in_stack_fffffffffffffbd0);
      SpanReader::operator>>
                ((SpanReader *)in_stack_fffffffffffffbd8,(CScript *)in_stack_fffffffffffffbd0);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbd8,
                 (size_type)in_stack_fffffffffffffbd0);
      SpanReader::operator>>
                ((SpanReader *)in_stack_fffffffffffffbd8,
                 (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffbf7 =
           SpanReader::empty((SpanReader *)
                             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      if ((bool)in_stack_fffffffffffffbf7) goto LAB_01407b88;
      std::optional<SignetTxs>::optional(in_RDI);
    }
    else {
LAB_01407b88:
      ComputeModifiedMerkleRoot(pCVar6,block_00);
      pCVar6 = &local_338;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      VectorWriter::VectorWriter
                ((VectorWriter *)pCVar6,in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8)
      ;
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffbd8,(uint256 *)in_stack_fffffffffffffbd0);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffbd8,(uint256 *)in_stack_fffffffffffffbd0);
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffbd8,(uint *)in_stack_fffffffffffffbd0);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbd8,
                 (size_type)in_stack_fffffffffffffbd0);
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0)
      ;
      b._M_ptr._7_1_ = uVar2;
      b._M_ptr._0_7_ = in_stack_fffffffffffffc00;
      b._M_extent._M_extent_value = _Var4._M_extent_value;
      CScript::operator<<((CScript *)pCVar6,b);
      CMutableTransaction::GetHash(pCVar6);
      COutPoint::COutPoint
                (in_stack_fffffffffffffbd8,(Txid *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbcc);
      in_stack_fffffffffffffbd8 = (COutPoint *)local_298;
      pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffbd8,
                          (size_type)in_stack_fffffffffffffbd0);
      (pvVar5->prevout).n = local_dc;
      *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
           = local_ec;
      *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
           = uStack_e4;
      *(undefined8 *)(pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
           local_fc;
      *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
           uStack_f4;
      SignetTxs<CMutableTransaction,CMutableTransaction>
                (this,(CMutableTransaction *)
                      CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),pCVar6);
      std::optional<SignetTxs>::optional<SignetTxs,_true>
                ((optional<SignetTxs> *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      ~SignetTxs((SignetTxs *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd8)
      ;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd8);
  }
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
LAB_01407dc8:
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::optional<SignetTxs> SignetTxs::Create(const CBlock& block, const CScript& challenge)
{
    CMutableTransaction tx_to_spend;
    tx_to_spend.version = 0;
    tx_to_spend.nLockTime = 0;
    tx_to_spend.vin.emplace_back(COutPoint(), CScript(OP_0), 0);
    tx_to_spend.vout.emplace_back(0, challenge);

    CMutableTransaction tx_spending;
    tx_spending.version = 0;
    tx_spending.nLockTime = 0;
    tx_spending.vin.emplace_back(COutPoint(), CScript(), 0);
    tx_spending.vout.emplace_back(0, CScript(OP_RETURN));

    // can't fill any other fields before extracting signet
    // responses from block coinbase tx

    // find and delete signet signature
    if (block.vtx.empty()) return std::nullopt; // no coinbase tx in block; invalid
    CMutableTransaction modified_cb(*block.vtx.at(0));

    const int cidx = GetWitnessCommitmentIndex(block);
    if (cidx == NO_WITNESS_COMMITMENT) {
        return std::nullopt; // require a witness commitment
    }

    CScript& witness_commitment = modified_cb.vout.at(cidx).scriptPubKey;

    std::vector<uint8_t> signet_solution;
    if (!FetchAndClearCommitmentSection(SIGNET_HEADER, witness_commitment, signet_solution)) {
        // no signet solution -- allow this to support OP_TRUE as trivial block challenge
    } else {
        try {
            SpanReader v{signet_solution};
            v >> tx_spending.vin[0].scriptSig;
            v >> tx_spending.vin[0].scriptWitness.stack;
            if (!v.empty()) return std::nullopt; // extraneous data encountered
        } catch (const std::exception&) {
            return std::nullopt; // parsing error
        }
    }
    uint256 signet_merkle = ComputeModifiedMerkleRoot(modified_cb, block);

    std::vector<uint8_t> block_data;
    VectorWriter writer{block_data, 0};
    writer << block.nVersion;
    writer << block.hashPrevBlock;
    writer << signet_merkle;
    writer << block.nTime;
    tx_to_spend.vin[0].scriptSig << block_data;
    tx_spending.vin[0].prevout = COutPoint(tx_to_spend.GetHash(), 0);

    return SignetTxs{tx_to_spend, tx_spending};
}